

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O1

boolean jtransform_request_workspace(j_decompress_ptr srcinfo,jpeg_transform_info *info)

{
  JXFORM_CODE JVar1;
  j_decompress_ptr pjVar2;
  jpeg_error_mgr *pjVar3;
  jpeg_component_info *pjVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  jvirt_barray_ptr *ppjVar9;
  jvirt_barray_ptr pjVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  JDIMENSION JVar19;
  long lVar20;
  long lVar21;
  
  if (((info->force_grayscale == 0) || (srcinfo->jpeg_color_space != JCS_YCbCr)) ||
     (iVar12 = 1, srcinfo->num_components != 3)) {
    iVar12 = srcinfo->num_components;
  }
  info->num_components = iVar12;
  uVar8 = srcinfo->image_width;
  uVar14 = srcinfo->image_height;
  srcinfo->output_width = uVar8;
  srcinfo->output_height = uVar14;
  if (info->perfect != 0) {
    uVar7 = uVar14;
    if (info->num_components == 1) {
      JVar1 = info->transform;
      if (JVar1 < JXFORM_WIPE) {
        uVar13 = srcinfo->min_DCT_scaled_size;
        if ((0x24U >> (JVar1 & 0x1f) & 1) == 0) {
          uVar7 = uVar13;
          if ((0x50U >> (JVar1 & 0x1f) & 1) == 0) {
            uVar7 = uVar8;
            if ((0x82U >> (JVar1 & 0x1f) & 1) == 0) goto LAB_001102cc;
            goto LAB_0011029d;
          }
LAB_001102b4:
          uVar7 = uVar14 % uVar13 | uVar8 % uVar7;
        }
        else {
LAB_0011029d:
          uVar7 = uVar7 % uVar13;
        }
LAB_001102c1:
        if (uVar7 != 0) {
          return 0;
        }
      }
    }
    else {
      JVar1 = info->transform;
      if (JVar1 < JXFORM_WIPE) {
        uVar13 = srcinfo->max_v_samp_factor * srcinfo->min_DCT_scaled_size;
        if ((0x24U >> (JVar1 & 0x1f) & 1) != 0) goto LAB_0011029d;
        uVar7 = srcinfo->min_DCT_scaled_size * srcinfo->max_h_samp_factor;
        if ((0x50U >> (JVar1 & 0x1f) & 1) != 0) goto LAB_001102b4;
        if ((0x82U >> (JVar1 & 0x1f) & 1) != 0) {
          uVar7 = uVar8 % uVar7;
          goto LAB_001102c1;
        }
      }
    }
  }
LAB_001102cc:
  JVar1 = info->transform;
  if ((JVar1 < JXFORM_WIPE) && ((0xb8U >> (JVar1 & 0x1f) & 1) != 0)) {
    info->output_width = uVar14;
    info->output_height = uVar8;
    if (info->num_components == 1) {
LAB_001102f1:
      iVar12 = srcinfo->min_DCT_scaled_size;
      info->iMCU_sample_width = iVar12;
    }
    else {
      iVar12 = srcinfo->min_DCT_scaled_size;
      info->iMCU_sample_width = srcinfo->max_v_samp_factor * iVar12;
      iVar12 = iVar12 * srcinfo->max_h_samp_factor;
    }
  }
  else {
    info->output_width = uVar8;
    info->output_height = uVar14;
    if (info->num_components == 1) goto LAB_001102f1;
    iVar12 = srcinfo->min_DCT_scaled_size;
    info->iMCU_sample_width = srcinfo->max_h_samp_factor * iVar12;
    iVar12 = iVar12 * srcinfo->max_v_samp_factor;
  }
  info->iMCU_sample_height = iVar12;
  if (info->crop == 0) {
    info->x_crop_offset = 0;
    uVar8 = 0;
  }
  else {
    if (info->crop_xoffset_set == JCROP_UNSET) {
      info->crop_xoffset = 0;
    }
    if (info->crop_yoffset_set == JCROP_UNSET) {
      info->crop_yoffset = 0;
    }
    uVar8 = info->output_width;
    if (info->crop_width_set == JCROP_UNSET) {
      if (uVar8 <= info->crop_xoffset) {
        pjVar3 = srcinfo->err;
        pjVar3->msg_code = 0x7c;
        (*pjVar3->error_exit)((j_common_ptr)srcinfo);
      }
      info->crop_width = info->output_width - info->crop_xoffset;
    }
    else {
      uVar14 = info->crop_width;
      if (uVar8 < uVar14) {
        if ((JVar1 != JXFORM_NONE) ||
           (uVar14 <= info->crop_xoffset || uVar14 - uVar8 < info->crop_xoffset)) {
LAB_001103dd:
          pjVar3 = srcinfo->err;
          pjVar3->msg_code = 0x7c;
          (*pjVar3->error_exit)((j_common_ptr)srcinfo);
        }
      }
      else if (((uVar8 - uVar14 < info->crop_xoffset) || (uVar14 == 0)) ||
              (uVar8 <= info->crop_xoffset)) goto LAB_001103dd;
    }
    uVar8 = info->output_height;
    if (info->crop_height_set == JCROP_UNSET) {
      if (uVar8 <= info->crop_yoffset) {
        pjVar3 = srcinfo->err;
        pjVar3->msg_code = 0x7c;
        (*pjVar3->error_exit)((j_common_ptr)srcinfo);
      }
      info->crop_height = info->output_height - info->crop_yoffset;
    }
    else {
      uVar14 = info->crop_height;
      if (uVar8 < uVar14) {
        if ((info->transform != JXFORM_NONE) ||
           (uVar14 <= info->crop_yoffset || uVar14 - uVar8 < info->crop_yoffset)) {
LAB_0011044c:
          pjVar3 = srcinfo->err;
          pjVar3->msg_code = 0x7c;
          (*pjVar3->error_exit)((j_common_ptr)srcinfo);
        }
      }
      else if (((uVar8 - uVar14 < info->crop_yoffset) || (uVar14 == 0)) ||
              (uVar8 <= info->crop_yoffset)) goto LAB_0011044c;
    }
    if (info->crop_xoffset_set == JCROP_NEG) {
      uVar8 = info->crop_width;
      uVar14 = info->output_width;
      if (uVar14 < uVar8) {
        uVar11 = (ulong)(uVar8 - (uVar14 + info->crop_xoffset));
      }
      else {
        uVar11 = (ulong)(uVar14 - (uVar8 + info->crop_xoffset));
      }
    }
    else {
      uVar11 = (ulong)info->crop_xoffset;
    }
    if (info->crop_yoffset_set == JCROP_NEG) {
      uVar8 = info->crop_height;
      uVar14 = info->output_height;
      if (uVar14 < uVar8) {
        JVar19 = uVar8 - (uVar14 + info->crop_yoffset);
      }
      else {
        JVar19 = uVar14 - (uVar8 + info->crop_yoffset);
      }
    }
    else {
      JVar19 = info->crop_yoffset;
    }
    if (info->transform == JXFORM_WIPE) {
      lVar16 = jdiv_round_up((ulong)((int)(uVar11 % (ulong)(uint)info->iMCU_sample_width) +
                                    info->crop_width),(long)info->iMCU_sample_width);
      info->drop_width = (JDIMENSION)lVar16;
      lVar16 = jdiv_round_up((ulong)(JVar19 % (uint)info->iMCU_sample_height + info->crop_height),
                             (long)info->iMCU_sample_height);
      info->drop_height = (JDIMENSION)lVar16;
    }
    else if (info->transform == JXFORM_DROP) {
      uVar8 = info->crop_width;
      uVar14 = info->iMCU_sample_width;
      iVar12 = (int)uVar11;
      uVar15 = ((iVar12 + uVar14) - 1) % uVar14;
      uVar13 = ~uVar15 + uVar14;
      uVar7 = uVar8 - uVar13;
      if (uVar8 < uVar13 || uVar7 == 0) {
        info->drop_width = 0;
      }
      else {
        if (uVar8 + iVar12 == info->output_width) {
          uVar7 = uVar15 + uVar8;
        }
        info->drop_width = uVar7 / uVar14;
      }
      uVar8 = info->crop_height;
      uVar14 = info->iMCU_sample_height;
      uVar15 = ((JVar19 + uVar14) - 1) % uVar14;
      uVar18 = ~uVar15 + uVar14;
      uVar7 = uVar8 - uVar18;
      if (uVar8 < uVar18 || uVar7 == 0) {
        info->drop_height = 0;
      }
      else {
        if (uVar8 + JVar19 == info->output_height) {
          uVar7 = uVar15 + uVar8;
        }
        info->drop_height = uVar7 / uVar14;
      }
      uVar11 = (ulong)(iVar12 + uVar13);
      JVar19 = JVar19 + uVar18;
      if (((info->drop_width != 0) && (info->drop_height != 0)) && (0 < info->num_components)) {
        lVar20 = 0;
        lVar16 = 0;
        do {
          pjVar2 = info->drop_ptr;
          if (pjVar2->num_components <= lVar16) break;
          if (srcinfo->max_h_samp_factor *
              *(int *)((long)&pjVar2->comp_info->h_samp_factor + lVar20) !=
              pjVar2->max_h_samp_factor *
              *(int *)((long)&srcinfo->comp_info->h_samp_factor + lVar20)) {
            pjVar3 = srcinfo->err;
            pjVar3->msg_code = 0x80;
            (pjVar3->msg_parm).i[0] = (int)lVar16;
            (srcinfo->err->msg_parm).i[1] =
                 *(int *)((long)&info->drop_ptr->comp_info->h_samp_factor + lVar20);
            (srcinfo->err->msg_parm).i[2] = info->drop_ptr->max_h_samp_factor;
            (srcinfo->err->msg_parm).i[3] =
                 *(int *)((long)&srcinfo->comp_info->h_samp_factor + lVar20);
            (srcinfo->err->msg_parm).i[4] = srcinfo->max_h_samp_factor;
            (srcinfo->err->msg_parm).i[5] = 0x68;
            (*srcinfo->err->error_exit)((j_common_ptr)srcinfo);
          }
          if (srcinfo->max_v_samp_factor *
              *(int *)((long)&info->drop_ptr->comp_info->v_samp_factor + lVar20) !=
              info->drop_ptr->max_v_samp_factor *
              *(int *)((long)&srcinfo->comp_info->v_samp_factor + lVar20)) {
            pjVar3 = srcinfo->err;
            pjVar3->msg_code = 0x80;
            (pjVar3->msg_parm).i[0] = (int)lVar16;
            (srcinfo->err->msg_parm).i[1] =
                 *(int *)((long)&info->drop_ptr->comp_info->v_samp_factor + lVar20);
            (srcinfo->err->msg_parm).i[2] = info->drop_ptr->max_v_samp_factor;
            (srcinfo->err->msg_parm).i[3] =
                 *(int *)((long)&srcinfo->comp_info->v_samp_factor + lVar20);
            (srcinfo->err->msg_parm).i[4] = srcinfo->max_v_samp_factor;
            (srcinfo->err->msg_parm).i[5] = 0x76;
            (*srcinfo->err->error_exit)((j_common_ptr)srcinfo);
          }
          lVar16 = lVar16 + 1;
          lVar20 = lVar20 + 0x60;
        } while (lVar16 < info->num_components);
      }
    }
    else {
      if ((info->crop_width_set == JCROP_FORCE) || (info->output_width < info->crop_width)) {
        info->output_width = info->crop_width;
      }
      else {
        info->output_width = (int)(uVar11 % (ulong)(uint)info->iMCU_sample_width) + info->crop_width
        ;
      }
      if ((info->crop_height_set == JCROP_FORCE) || (info->output_height < info->crop_height)) {
        info->output_height = info->crop_height;
      }
      else {
        info->output_height = JVar19 % (uint)info->iMCU_sample_height + info->crop_height;
      }
    }
    info->x_crop_offset = (JDIMENSION)(uVar11 / (uint)info->iMCU_sample_width);
    uVar8 = JVar19 / (uint)info->iMCU_sample_height;
  }
  info->y_crop_offset = uVar8;
  bVar6 = true;
  switch(info->transform) {
  case JXFORM_NONE:
    if ((info->x_crop_offset == 0) &&
       (((info->y_crop_offset == 0 && (info->output_width <= srcinfo->output_width)) &&
        (info->output_height <= srcinfo->output_height)))) goto switchD_0011076c_default;
    break;
  case JXFORM_FLIP_H:
    if (info->trim != 0) {
      uVar8 = info->iMCU_sample_width;
      uVar14 = info->output_width / uVar8;
      if ((uVar8 <= info->output_width) &&
         (info->x_crop_offset + uVar14 == srcinfo->output_width / uVar8)) {
        info->output_width = uVar14 * uVar8;
      }
    }
    if ((info->y_crop_offset == 0) && (info->slow_hflip == 0)) goto switchD_0011076c_default;
    break;
  case JXFORM_FLIP_V:
    if (info->trim != 0) {
LAB_001109ef:
      uVar8 = info->iMCU_sample_height;
      bVar5 = false;
      uVar14 = info->output_height / uVar8;
      if ((info->output_height < uVar8) ||
         (bVar5 = false, info->y_crop_offset + uVar14 != srcinfo->output_height / uVar8))
      goto LAB_001108eb;
      info->output_height = uVar14 * uVar8;
    }
    break;
  case JXFORM_TRANSPOSE:
    goto switchD_0011076c_caseD_3;
  case JXFORM_TRANSVERSE:
    if (info->trim != 0) {
      uVar8 = info->iMCU_sample_width;
      uVar14 = info->output_width / uVar8;
      if ((uVar8 <= info->output_width) &&
         (info->x_crop_offset + uVar14 == srcinfo->output_height / uVar8)) {
        info->output_width = uVar14 * uVar8;
      }
LAB_001107fa:
      uVar8 = info->iMCU_sample_height;
      bVar6 = false;
      uVar14 = info->output_height / uVar8;
      bVar5 = false;
      if ((info->output_height < uVar8) ||
         (bVar6 = false, info->y_crop_offset + uVar14 != srcinfo->output_width / uVar8))
      goto LAB_001108eb;
      info->output_height = uVar14 * uVar8;
    }
    goto switchD_0011076c_caseD_3;
  case JXFORM_ROT_90:
    if (info->trim != 0) {
      uVar8 = info->iMCU_sample_width;
      bVar6 = false;
      uVar14 = info->output_width / uVar8;
      bVar5 = false;
      if ((info->output_width < uVar8) ||
         (bVar6 = false, info->x_crop_offset + uVar14 != srcinfo->output_height / uVar8))
      goto LAB_001108eb;
      info->output_width = uVar14 * uVar8;
    }
    goto switchD_0011076c_caseD_3;
  case JXFORM_ROT_180:
    if (info->trim != 0) {
      uVar8 = info->iMCU_sample_width;
      uVar14 = info->output_width / uVar8;
      if ((uVar8 <= info->output_width) &&
         (info->x_crop_offset + uVar14 == srcinfo->output_width / uVar8)) {
        info->output_width = uVar14 * uVar8;
      }
      goto LAB_001109ef;
    }
    break;
  case JXFORM_ROT_270:
    if (info->trim != 0) goto LAB_001107fa;
switchD_0011076c_caseD_3:
    bVar6 = false;
    break;
  default:
switchD_0011076c_default:
    bVar5 = true;
    goto LAB_001108eb;
  }
  bVar5 = false;
LAB_001108eb:
  if (bVar5) {
    ppjVar9 = (jvirt_barray_ptr *)0x0;
  }
  else {
    ppjVar9 = (jvirt_barray_ptr *)
              (*srcinfo->mem->alloc_small)((j_common_ptr)srcinfo,1,(long)info->num_components << 3);
    lVar16 = jdiv_round_up((ulong)info->output_width,(long)info->iMCU_sample_width);
    lVar20 = jdiv_round_up((ulong)info->output_height,(long)info->iMCU_sample_height);
    uVar11 = (ulong)(uint)info->num_components;
    if (0 < info->num_components) {
      lVar17 = 0xc;
      lVar21 = 0;
      do {
        iVar12 = 1;
        JVar19 = 1;
        if ((int)uVar11 != 1) {
          pjVar4 = srcinfo->comp_info;
          if (bVar6) {
            iVar12 = *(int *)((long)pjVar4 + lVar17 + -4);
            JVar19 = *(JDIMENSION *)((long)&pjVar4->component_id + lVar17);
          }
          else {
            JVar19 = *(JDIMENSION *)((long)pjVar4 + lVar17 + -4);
            iVar12 = *(int *)((long)&pjVar4->component_id + lVar17);
          }
        }
        pjVar10 = (*srcinfo->mem->request_virt_barray)
                            ((j_common_ptr)srcinfo,1,0,iVar12 * (int)lVar16,JVar19 * (int)lVar20,
                             JVar19);
        ppjVar9[lVar21] = pjVar10;
        lVar21 = lVar21 + 1;
        uVar11 = (ulong)info->num_components;
        lVar17 = lVar17 + 0x60;
      } while (lVar21 < (long)uVar11);
    }
  }
  info->workspace_coef_arrays = ppjVar9;
  return 1;
}

Assistant:

GLOBAL(boolean)
jtransform_request_workspace(j_decompress_ptr srcinfo,
                             jpeg_transform_info *info)
{
  jvirt_barray_ptr *coef_arrays;
  boolean need_workspace, transpose_it;
  jpeg_component_info *compptr;
  JDIMENSION xoffset, yoffset, dtemp;
  JDIMENSION width_in_iMCUs, height_in_iMCUs;
  JDIMENSION width_in_blocks, height_in_blocks;
  int itemp, ci, h_samp_factor, v_samp_factor;

  /* Determine number of components in output image */
  if (info->force_grayscale &&
      srcinfo->jpeg_color_space == JCS_YCbCr &&
      srcinfo->num_components == 3)
    /* We'll only process the first component */
    info->num_components = 1;
  else
    /* Process all the components */
    info->num_components = srcinfo->num_components;

  /* Compute output image dimensions and related values. */
#if JPEG_LIB_VERSION >= 80
  jpeg_core_output_dimensions(srcinfo);
#else
  srcinfo->output_width = srcinfo->image_width;
  srcinfo->output_height = srcinfo->image_height;
#endif

  /* Return right away if -perfect is given and transformation is not perfect.
   */
  if (info->perfect) {
    if (info->num_components == 1) {
      if (!jtransform_perfect_transform(srcinfo->output_width,
          srcinfo->output_height,
          srcinfo->_min_DCT_h_scaled_size,
          srcinfo->_min_DCT_v_scaled_size,
          info->transform))
        return FALSE;
    } else {
      if (!jtransform_perfect_transform(srcinfo->output_width,
          srcinfo->output_height,
          srcinfo->max_h_samp_factor * srcinfo->_min_DCT_h_scaled_size,
          srcinfo->max_v_samp_factor * srcinfo->_min_DCT_v_scaled_size,
          info->transform))
        return FALSE;
    }
  }

  /* If there is only one output component, force the iMCU size to be 1;
   * else use the source iMCU size.  (This allows us to do the right thing
   * when reducing color to grayscale, and also provides a handy way of
   * cleaning up "funny" grayscale images whose sampling factors are not 1x1.)
   */
  switch (info->transform) {
  case JXFORM_TRANSPOSE:
  case JXFORM_TRANSVERSE:
  case JXFORM_ROT_90:
  case JXFORM_ROT_270:
    info->output_width = srcinfo->output_height;
    info->output_height = srcinfo->output_width;
    if (info->num_components == 1) {
      info->iMCU_sample_width = srcinfo->_min_DCT_v_scaled_size;
      info->iMCU_sample_height = srcinfo->_min_DCT_h_scaled_size;
    } else {
      info->iMCU_sample_width =
        srcinfo->max_v_samp_factor * srcinfo->_min_DCT_v_scaled_size;
      info->iMCU_sample_height =
        srcinfo->max_h_samp_factor * srcinfo->_min_DCT_h_scaled_size;
    }
    break;
  default:
    info->output_width = srcinfo->output_width;
    info->output_height = srcinfo->output_height;
    if (info->num_components == 1) {
      info->iMCU_sample_width = srcinfo->_min_DCT_h_scaled_size;
      info->iMCU_sample_height = srcinfo->_min_DCT_v_scaled_size;
    } else {
      info->iMCU_sample_width =
        srcinfo->max_h_samp_factor * srcinfo->_min_DCT_h_scaled_size;
      info->iMCU_sample_height =
        srcinfo->max_v_samp_factor * srcinfo->_min_DCT_v_scaled_size;
    }
    break;
  }

  /* If cropping has been requested, compute the crop area's position and
   * dimensions, ensuring that its upper left corner falls at an iMCU boundary.
   */
  if (info->crop) {
    /* Insert default values for unset crop parameters */
    if (info->crop_xoffset_set == JCROP_UNSET)
      info->crop_xoffset = 0;   /* default to +0 */
    if (info->crop_yoffset_set == JCROP_UNSET)
      info->crop_yoffset = 0;   /* default to +0 */
    if (info->crop_width_set == JCROP_UNSET) {
      if (info->crop_xoffset >= info->output_width)
        ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      info->crop_width = info->output_width - info->crop_xoffset;
    } else {
      /* Check for crop extension */
      if (info->crop_width > info->output_width) {
        /* Crop extension does not work when transforming! */
        if (info->transform != JXFORM_NONE ||
            info->crop_xoffset >= info->crop_width ||
            info->crop_xoffset > info->crop_width - info->output_width)
          ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      } else {
        if (info->crop_xoffset >= info->output_width ||
            info->crop_width <= 0 ||
            info->crop_xoffset > info->output_width - info->crop_width)
          ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      }
    }
    if (info->crop_height_set == JCROP_UNSET) {
      if (info->crop_yoffset >= info->output_height)
        ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      info->crop_height = info->output_height - info->crop_yoffset;
    } else {
      /* Check for crop extension */
      if (info->crop_height > info->output_height) {
        /* Crop extension does not work when transforming! */
        if (info->transform != JXFORM_NONE ||
            info->crop_yoffset >= info->crop_height ||
            info->crop_yoffset > info->crop_height - info->output_height)
          ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      } else {
        if (info->crop_yoffset >= info->output_height ||
            info->crop_height <= 0 ||
            info->crop_yoffset > info->output_height - info->crop_height)
          ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      }
    }
    /* Convert negative crop offsets into regular offsets */
    if (info->crop_xoffset_set != JCROP_NEG)
      xoffset = info->crop_xoffset;
    else if (info->crop_width > info->output_width) /* crop extension */
      xoffset = info->crop_width - info->output_width - info->crop_xoffset;
    else
      xoffset = info->output_width - info->crop_width - info->crop_xoffset;
    if (info->crop_yoffset_set != JCROP_NEG)
      yoffset = info->crop_yoffset;
    else if (info->crop_height > info->output_height) /* crop extension */
      yoffset = info->crop_height - info->output_height - info->crop_yoffset;
    else
      yoffset = info->output_height - info->crop_height - info->crop_yoffset;
    /* Now adjust so that upper left corner falls at an iMCU boundary */
    switch (info->transform) {
    case JXFORM_DROP:
      /* Ensure the effective drop region will not exceed the requested */
      itemp = info->iMCU_sample_width;
      dtemp = itemp - 1 - ((xoffset + itemp - 1) % itemp);
      xoffset += dtemp;
      if (info->crop_width <= dtemp)
        info->drop_width = 0;
      else if (xoffset + info->crop_width - dtemp == info->output_width)
        /* Matching right edge: include partial iMCU */
        info->drop_width = (info->crop_width - dtemp + itemp - 1) / itemp;
      else
        info->drop_width = (info->crop_width - dtemp) / itemp;
      itemp = info->iMCU_sample_height;
      dtemp = itemp - 1 - ((yoffset + itemp - 1) % itemp);
      yoffset += dtemp;
      if (info->crop_height <= dtemp)
        info->drop_height = 0;
      else if (yoffset + info->crop_height - dtemp == info->output_height)
        /* Matching bottom edge: include partial iMCU */
        info->drop_height = (info->crop_height - dtemp + itemp - 1) / itemp;
      else
        info->drop_height = (info->crop_height - dtemp) / itemp;
      /* Check if sampling factors match for dropping */
      if (info->drop_width != 0 && info->drop_height != 0)
        for (ci = 0; ci < info->num_components &&
                     ci < info->drop_ptr->num_components; ci++) {
          if (info->drop_ptr->comp_info[ci].h_samp_factor *
              srcinfo->max_h_samp_factor !=
              srcinfo->comp_info[ci].h_samp_factor *
              info->drop_ptr->max_h_samp_factor)
            ERREXIT6(srcinfo, JERR_BAD_DROP_SAMPLING, ci,
              info->drop_ptr->comp_info[ci].h_samp_factor,
              info->drop_ptr->max_h_samp_factor,
              srcinfo->comp_info[ci].h_samp_factor,
              srcinfo->max_h_samp_factor, 'h');
          if (info->drop_ptr->comp_info[ci].v_samp_factor *
              srcinfo->max_v_samp_factor !=
              srcinfo->comp_info[ci].v_samp_factor *
              info->drop_ptr->max_v_samp_factor)
            ERREXIT6(srcinfo, JERR_BAD_DROP_SAMPLING, ci,
              info->drop_ptr->comp_info[ci].v_samp_factor,
              info->drop_ptr->max_v_samp_factor,
              srcinfo->comp_info[ci].v_samp_factor,
              srcinfo->max_v_samp_factor, 'v');
        }
      break;
    case JXFORM_WIPE:
      /* Ensure the effective wipe region will cover the requested */
      info->drop_width = (JDIMENSION)jdiv_round_up
        ((long)(info->crop_width + (xoffset % info->iMCU_sample_width)),
         (long)info->iMCU_sample_width);
      info->drop_height = (JDIMENSION)jdiv_round_up
        ((long)(info->crop_height + (yoffset % info->iMCU_sample_height)),
         (long)info->iMCU_sample_height);
      break;
    default:
      /* Ensure the effective crop region will cover the requested */
      if (info->crop_width_set == JCROP_FORCE ||
          info->crop_width > info->output_width)
        info->output_width = info->crop_width;
      else
        info->output_width =
          info->crop_width + (xoffset % info->iMCU_sample_width);
      if (info->crop_height_set == JCROP_FORCE ||
          info->crop_height > info->output_height)
        info->output_height = info->crop_height;
      else
        info->output_height =
          info->crop_height + (yoffset % info->iMCU_sample_height);
    }
    /* Save x/y offsets measured in iMCUs */
    info->x_crop_offset = xoffset / info->iMCU_sample_width;
    info->y_crop_offset = yoffset / info->iMCU_sample_height;
  } else {
    info->x_crop_offset = 0;
    info->y_crop_offset = 0;
  }

  /* Figure out whether we need workspace arrays,
   * and if so whether they are transposed relative to the source.
   */
  need_workspace = FALSE;
  transpose_it = FALSE;
  switch (info->transform) {
  case JXFORM_NONE:
    if (info->x_crop_offset != 0 || info->y_crop_offset != 0 ||
        info->output_width > srcinfo->output_width ||
        info->output_height > srcinfo->output_height)
      need_workspace = TRUE;
    /* No workspace needed if neither cropping nor transforming */
    break;
  case JXFORM_FLIP_H:
    if (info->trim)
      trim_right_edge(info, srcinfo->output_width);
    if (info->y_crop_offset != 0 || info->slow_hflip)
      need_workspace = TRUE;
    /* do_flip_h_no_crop doesn't need a workspace array */
    break;
  case JXFORM_FLIP_V:
    if (info->trim)
      trim_bottom_edge(info, srcinfo->output_height);
    /* Need workspace arrays having same dimensions as source image. */
    need_workspace = TRUE;
    break;
  case JXFORM_TRANSPOSE:
    /* transpose does NOT have to trim anything */
    /* Need workspace arrays having transposed dimensions. */
    need_workspace = TRUE;
    transpose_it = TRUE;
    break;
  case JXFORM_TRANSVERSE:
    if (info->trim) {
      trim_right_edge(info, srcinfo->output_height);
      trim_bottom_edge(info, srcinfo->output_width);
    }
    /* Need workspace arrays having transposed dimensions. */
    need_workspace = TRUE;
    transpose_it = TRUE;
    break;
  case JXFORM_ROT_90:
    if (info->trim)
      trim_right_edge(info, srcinfo->output_height);
    /* Need workspace arrays having transposed dimensions. */
    need_workspace = TRUE;
    transpose_it = TRUE;
    break;
  case JXFORM_ROT_180:
    if (info->trim) {
      trim_right_edge(info, srcinfo->output_width);
      trim_bottom_edge(info, srcinfo->output_height);
    }
    /* Need workspace arrays having same dimensions as source image. */
    need_workspace = TRUE;
    break;
  case JXFORM_ROT_270:
    if (info->trim)
      trim_bottom_edge(info, srcinfo->output_width);
    /* Need workspace arrays having transposed dimensions. */
    need_workspace = TRUE;
    transpose_it = TRUE;
    break;
  case JXFORM_WIPE:
    break;
  case JXFORM_DROP:
    break;
  }

  /* Allocate workspace if needed.
   * Note that we allocate arrays padded out to the next iMCU boundary,
   * so that transform routines need not worry about missing edge blocks.
   */
  if (need_workspace) {
    coef_arrays = (jvirt_barray_ptr *)
      (*srcinfo->mem->alloc_small) ((j_common_ptr)srcinfo, JPOOL_IMAGE,
                sizeof(jvirt_barray_ptr) * info->num_components);
    width_in_iMCUs = (JDIMENSION)
      jdiv_round_up((long)info->output_width, (long)info->iMCU_sample_width);
    height_in_iMCUs = (JDIMENSION)
      jdiv_round_up((long)info->output_height, (long)info->iMCU_sample_height);
    for (ci = 0; ci < info->num_components; ci++) {
      compptr = srcinfo->comp_info + ci;
      if (info->num_components == 1) {
        /* we're going to force samp factors to 1x1 in this case */
        h_samp_factor = v_samp_factor = 1;
      } else if (transpose_it) {
        h_samp_factor = compptr->v_samp_factor;
        v_samp_factor = compptr->h_samp_factor;
      } else {
        h_samp_factor = compptr->h_samp_factor;
        v_samp_factor = compptr->v_samp_factor;
      }
      width_in_blocks = width_in_iMCUs * h_samp_factor;
      height_in_blocks = height_in_iMCUs * v_samp_factor;
      coef_arrays[ci] = (*srcinfo->mem->request_virt_barray)
        ((j_common_ptr)srcinfo, JPOOL_IMAGE, FALSE,
         width_in_blocks, height_in_blocks, (JDIMENSION)v_samp_factor);
    }
    info->workspace_coef_arrays = coef_arrays;
  } else
    info->workspace_coef_arrays = NULL;

  return TRUE;
}